

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_if_udp.c
# Opt level: O0

int csp_if_udp_tx(csp_iface_t *iface,uint16_t via,csp_packet_t *packet,int from_me)

{
  uint16_t uVar1;
  long in_RDX;
  long in_RDI;
  csp_if_udp_conf_t *ifconf;
  void *packet_00;
  
  packet_00 = *(void **)(in_RDI + 0x18);
  if (*(int *)((long)packet_00 + 0x28) == 0) {
    csp_print_func("Sockfd null\n");
    csp_buffer_free(packet_00);
  }
  else {
    csp_id_prepend((csp_packet_t *)0x114e9f);
    *(undefined2 *)((long)packet_00 + 0x18) = 2;
    uVar1 = htons((uint16_t)*(undefined4 *)((long)packet_00 + 0xc));
    *(uint16_t *)((long)packet_00 + 0x1a) = uVar1;
    sendto(*(int *)((long)packet_00 + 0x28),*(void **)(in_RDX + 0x10),
           (ulong)*(ushort *)(in_RDX + 0x18),0x800,(sockaddr *)((long)packet_00 + 0x18),0x10);
    csp_buffer_free(packet_00);
  }
  return 0;
}

Assistant:

static int csp_if_udp_tx(csp_iface_t * iface, uint16_t via, csp_packet_t * packet, int from_me) {

	csp_if_udp_conf_t * ifconf = iface->driver_data;

	if (ifconf->sockfd == 0) {
		csp_print("Sockfd null\n");
		csp_buffer_free(packet);
		return CSP_ERR_NONE;
	}

	csp_id_prepend(packet);
	ifconf->peer_addr.sin_family = AF_INET;
	ifconf->peer_addr.sin_port = htons(ifconf->rport);
	sendto(ifconf->sockfd, packet->frame_begin, packet->frame_length, MSG_CONFIRM, (struct sockaddr *)&ifconf->peer_addr, sizeof(ifconf->peer_addr));
	csp_buffer_free(packet);

	return CSP_ERR_NONE;
}